

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void renameParentFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3 *db;
  int n;
  int iVar1;
  uchar *z;
  char *z_00;
  char *pcVar2;
  char *p;
  int token;
  uchar *local_50;
  sqlite3_context *local_48;
  uchar *local_40;
  uchar *local_38;
  
  db = (context->s).db;
  local_48 = context;
  z = sqlite3_value_text(*argv);
  local_38 = sqlite3_value_text(argv[1]);
  local_40 = sqlite3_value_text(argv[2]);
  p = (char *)0x0;
  local_50 = z;
  for (; *z != '\0'; z = z + n) {
    n = sqlite3GetToken(z,&token);
    pcVar2 = p;
    if (token == 0x66) {
      do {
        z = z + n;
        n = sqlite3GetToken(z,&token);
      } while (token == 0x95);
      z_00 = sqlite3DbStrNDup(db,(char *)z,n);
      if (z_00 == (char *)0x0) break;
      sqlite3Dequote(z_00);
      iVar1 = sqlite3_stricmp((char *)local_38,z_00);
      if (iVar1 == 0) {
        if (p == (char *)0x0) {
          pcVar2 = "";
        }
        pcVar2 = sqlite3MPrintf(db,"%s%.*s\"%w\"",pcVar2,(long)z - (long)local_50,local_50,local_40)
        ;
        sqlite3DbFree(db,p);
        local_50 = z + n;
      }
      sqlite3DbFree(db,z_00);
    }
    p = pcVar2;
  }
  pcVar2 = "";
  if (p != (char *)0x0) {
    pcVar2 = p;
  }
  pcVar2 = sqlite3MPrintf(db,"%s%s",pcVar2,local_50);
  sqlite3_result_text(local_48,pcVar2,-1,sqlite3MallocSize);
  sqlite3DbFree(db,p);
  return;
}

Assistant:

static void renameParentFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zOutput = 0;
  char *zResult;
  unsigned char const *zInput = sqlite3_value_text(argv[0]);
  unsigned char const *zOld = sqlite3_value_text(argv[1]);
  unsigned char const *zNew = sqlite3_value_text(argv[2]);

  unsigned const char *z;         /* Pointer to token */
  int n;                          /* Length of token z */
  int token;                      /* Type of token */

  UNUSED_PARAMETER(NotUsed);
  for(z=zInput; *z; z=z+n){
    n = sqlite3GetToken(z, &token);
    if( token==TK_REFERENCES ){
      char *zParent;
      do {
        z += n;
        n = sqlite3GetToken(z, &token);
      }while( token==TK_SPACE );

      zParent = sqlite3DbStrNDup(db, (const char *)z, n);
      if( zParent==0 ) break;
      sqlite3Dequote(zParent);
      if( 0==sqlite3StrICmp((const char *)zOld, zParent) ){
        char *zOut = sqlite3MPrintf(db, "%s%.*s\"%w\"", 
            (zOutput?zOutput:""), z-zInput, zInput, (const char *)zNew
        );
        sqlite3DbFree(db, zOutput);
        zOutput = zOut;
        zInput = &z[n];
      }
      sqlite3DbFree(db, zParent);
    }
  }

  zResult = sqlite3MPrintf(db, "%s%s", (zOutput?zOutput:""), zInput), 
  sqlite3_result_text(context, zResult, -1, SQLITE_DYNAMIC);
  sqlite3DbFree(db, zOutput);
}